

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.h
# Opt level: O2

void __thiscall
TPZFront<float>::STensorProductMTData::~STensorProductMTData(STensorProductMTData *this)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  this->fRunning = false;
  uVar1 = (uint)(this->fWorkSem).fNElements;
  uVar4 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar4;
  }
  for (; uVar2 * 0x60 - uVar4 != 0; uVar4 = uVar4 + 0x60) {
    TPZSemaphore::Post((TPZSemaphore *)((long)&((this->fWorkSem).fStore)->fCounter + uVar4));
  }
  for (lVar3 = 0; uVar2 * 8 != lVar3; lVar3 = lVar3 + 8) {
    std::thread::join();
    operator_delete(*(void **)((long)(this->fThreadData).fStore + lVar3),0x10);
    *(undefined8 *)((long)(this->fThreadData).fStore + lVar3) = 0;
  }
  TPZVec<std::pair<int,_TPZFront<float>::STensorProductMTData_*>_*>::~TPZVec(&this->fThreadData);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->fThreads);
  TPZVec<TPZSemaphore>::~TPZVec(&this->fWorkSem);
  std::condition_variable::~condition_variable(&(this->fWorkDoneSem).fCond);
  return;
}

Assistant:

~STensorProductMTData(){
			
			this->fRunning = false;
			const int nthreads = fWorkSem.NElements();
			for(int i = 0; i < nthreads; i++){
        fWorkSem[i].Post();
			}
			for(int i = 0; i < nthreads; i++){
        fThreads[i].join();
				delete fThreadData[i];
				fThreadData[i] = NULL;
			}
			
		}